

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chartype.c
# Opt level: O1

ssize_t ct_encode_char(char *dst,size_t len,wchar_t c)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  mbstate_t mbs;
  char buf [16];
  mbstate_t local_30;
  char local_28 [16];
  
  local_30.__count = 0;
  local_30.__value = (_union_27)0x0;
  sVar2 = wcrtomb(local_28,c,&local_30);
  sVar3 = -1;
  if (sVar2 == 0xffffffffffffffff || sVar2 <= len) {
    iVar1 = wctomb(dst,c);
    if (iVar1 < 0) {
      sVar3 = 0;
      wctomb((char *)0x0,L'\0');
    }
    else {
      sVar3 = (ssize_t)iVar1;
    }
  }
  return sVar3;
}

Assistant:

libedit_private ssize_t
ct_encode_char(char *dst, size_t len, wchar_t c)
{
	ssize_t l = 0;
	if (len < ct_enc_width(c))
		return -1;
	l = wctomb(dst, c);

	if (l < 0) {
		wctomb(NULL, L'\0');
		l = 0;
	}
	return l;
}